

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall
QList<QItemSelectionRange>::reserve(QList<QItemSelectionRange> *this,qsizetype asize)

{
  bool bVar1;
  qsizetype qVar2;
  qsizetype qVar3;
  QGenericArrayOps<QItemSelectionRange> *this_00;
  Data *pDVar4;
  long in_RSI;
  QArrayDataPointer<QItemSelectionRange> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  undefined4 in_stack_ffffffffffffff58;
  QFlagsStorage<QArrayData::ArrayOption> in_stack_ffffffffffffff5c;
  QArrayDataPointer<QItemSelectionRange> *in_stack_ffffffffffffff60;
  QArrayDataPointer<QItemSelectionRange> *in_stack_ffffffffffffff68;
  QArrayDataPointer<QItemSelectionRange> *this_01;
  qsizetype in_stack_ffffffffffffff70;
  qsizetype in_stack_ffffffffffffff78;
  QArrayDataPointer<QItemSelectionRange> *in_stack_ffffffffffffff80;
  qsizetype local_40;
  QArrayDataPointer<QItemSelectionRange> local_38;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_18;
  QFlagsStorageHelper<QArrayData::ArrayOption,_4> local_14;
  longlong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  qVar2 = capacity((QList<QItemSelectionRange> *)0x835ac5);
  qVar3 = QArrayDataPointer<QItemSelectionRange>::freeSpaceAtBegin(in_stack_ffffffffffffff68);
  if (in_RSI <= qVar2 - qVar3) {
    QArrayDataPointer<QItemSelectionRange>::operator->(in_RDI);
    local_18.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QArrayDataPointer<QItemSelectionRange>::flags(in_stack_ffffffffffffff60);
    local_14.super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (QFlagsStorage<QArrayData::ArrayOption>)
         QFlags<QArrayData::ArrayOption>::operator&
                   ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                    in_stack_ffffffffffffff5c.i);
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    if (bVar1) goto LAB_00835ca1;
    QArrayDataPointer<QItemSelectionRange>::operator->(in_RDI);
    bVar1 = QArrayDataPointer<QItemSelectionRange>::isShared(in_stack_ffffffffffffff60);
    if (!bVar1) {
      QArrayDataPointer<QItemSelectionRange>::operator->(in_RDI);
      QFlags<QArrayData::ArrayOption>::QFlags
                ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff5c.i);
      QArrayDataPointer<QItemSelectionRange>::setFlag
                ((QArrayDataPointer<QItemSelectionRange> *)0x835b7f,
                 (ArrayOptions)in_stack_ffffffffffffff5c.i);
      goto LAB_00835ca1;
    }
  }
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QItemSelectionRange *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_40 = size((QList<QItemSelectionRange> *)in_RDI);
  qMax<long_long>(&local_10,&local_40);
  this_01 = &local_38;
  QArrayDataPointer<QItemSelectionRange>::QArrayDataPointer
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             (AllocationOption)((ulong)this_01 >> 0x20));
  this_00 = (QGenericArrayOps<QItemSelectionRange> *)
            QArrayDataPointer<QItemSelectionRange>::operator->(this_01);
  QArrayDataPointer<QItemSelectionRange>::operator->(in_RDI);
  QArrayDataPointer<QItemSelectionRange>::begin((QArrayDataPointer<QItemSelectionRange> *)0x835c01);
  QArrayDataPointer<QItemSelectionRange>::operator->(in_RDI);
  QArrayDataPointer<QItemSelectionRange>::end(in_stack_ffffffffffffff60);
  QtPrivate::QGenericArrayOps<QItemSelectionRange>::copyAppend
            (this_00,(QItemSelectionRange *)this_01,(QItemSelectionRange *)in_stack_ffffffffffffff60
            );
  pDVar4 = QArrayDataPointer<QItemSelectionRange>::d_ptr(&local_38);
  if (pDVar4 != (Data *)0x0) {
    in_stack_ffffffffffffff60 =
         (QArrayDataPointer<QItemSelectionRange> *)
         QArrayDataPointer<QItemSelectionRange>::operator->(&local_38);
    QFlags<QArrayData::ArrayOption>::QFlags
              ((QFlags<QArrayData::ArrayOption> *)in_stack_ffffffffffffff60,
               in_stack_ffffffffffffff5c.i);
    QArrayDataPointer<QItemSelectionRange>::setFlag
              ((QArrayDataPointer<QItemSelectionRange> *)0x835c68,
               (ArrayOptions)in_stack_ffffffffffffff5c.i);
  }
  QArrayDataPointer<QItemSelectionRange>::swap
            (in_stack_ffffffffffffff60,
             (QArrayDataPointer<QItemSelectionRange> *)
             CONCAT44(in_stack_ffffffffffffff5c.i,in_stack_ffffffffffffff58));
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(in_stack_ffffffffffffff60);
LAB_00835ca1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QList<T>::reserve(qsizetype asize)
{
    // capacity() == 0 for immutable data, so this will force a detaching below
    if (asize <= capacity() - d.freeSpaceAtBegin()) {
        if (d->flags() & Data::CapacityReserved)
            return;  // already reserved, don't shrink
        if (!d->isShared()) {
            // accept current allocation, don't shrink
            d->setFlag(Data::CapacityReserved);
            return;
        }
    }

    DataPointer detached(qMax(asize, size()));
    detached->copyAppend(d->begin(), d->end());
    if (detached.d_ptr())
        detached->setFlag(Data::CapacityReserved);
    d.swap(detached);
}